

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O3

int rhash_file(uint hash_id,char *filepath,uchar *result)

{
  int iVar1;
  FILE *__stream;
  rhash ctx;
  int *piVar2;
  undefined8 unaff_RBX;
  
  if ((hash_id & 0x3ff) == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    __stream = fopen64(filepath,"rb");
    iVar1 = -1;
    if (__stream != (FILE *)0x0) {
      ctx = rhash_init((uint)((ulong)unaff_RBX >> 0x20));
      if (ctx == (rhash)0x0) {
        fclose(__stream);
      }
      else {
        iVar1 = rhash_file_update(ctx,(FILE *)__stream);
        fclose(__stream);
        if (-1 < iVar1) {
          rhash_final(ctx,result);
        }
        rhash_free(ctx);
      }
    }
  }
  return iVar1;
}

Assistant:

RHASH_API int rhash_file(unsigned hash_id, const char* filepath, unsigned char* result)
{
	FILE* fd;
	rhash ctx;
	int res;

	hash_id &= RHASH_ALL_HASHES;
	if (hash_id == 0) {
		errno = EINVAL;
		return -1;
	}

	fd = fopen(filepath, FOPEN_MODE);
	if (!fd)
		return -1;

	ctx = rhash_init(hash_id);
	if (!ctx) {
		fclose(fd);
		return -1;
	}
	res = rhash_file_update(ctx, fd); /* hash the file */
	fclose(fd);
	if (res >= 0)
		rhash_final(ctx, result);
	rhash_free(ctx);
	return res;
}